

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::OnAssertExceptionCommand
          (CommandRunner *this,AssertExceptionCommand *command)

{
  bool bVar1;
  char *format;
  Enum EVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  ActionResult result;
  
  RunAction(&result,this,(command->super_CommandMixin<(wabt::CommandType)11>).super_Command.line,
            &command->action,Quiet);
  if (result.trap.obj_ == (Trap *)0x0) {
    EVar2 = Error;
    format = "expected an exception to be thrown";
  }
  else {
    std::__cxx11::string::string((string *)&bStack_88,(string *)&(result.trap.obj_)->message_);
    bVar1 = std::operator!=(&bStack_88,"uncaught exception");
    std::__cxx11::string::_M_dispose();
    format = "assert_exception passed";
    if (bVar1) {
      format = "expected an exception to be thrown";
    }
    EVar2 = (Enum)bVar1;
  }
  PrintError(this,(command->super_CommandMixin<(wabt::CommandType)11>).super_Command.line,format);
  ActionResult::~ActionResult(&result);
  return (Result)EVar2;
}

Assistant:

wabt::Result CommandRunner::OnAssertExceptionCommand(
    const AssertExceptionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap || result.trap->message() != "uncaught exception") {
    PrintError(command->line, "expected an exception to be thrown");
    return wabt::Result::Error;
  }
  PrintError(command->line, "assert_exception passed");

  return wabt::Result::Ok;
}